

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::WriteToShardStatusFileIfNeeded(void)

{
  char *__filename;
  FILE *__stream;
  
  __filename = getenv("GTEST_SHARD_STATUS_FILE");
  if (__filename == (char *)0x0) {
    return;
  }
  __stream = fopen(__filename,"w");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    return;
  }
  ColoredPrintf(kRed,
                "Could not write to the test shard status file \"%s\" specified by the %s environment variable.\n"
                ,__filename,"GTEST_SHARD_STATUS_FILE");
  fflush(_stdout);
  exit(1);
}

Assistant:

AssertionResult CmpHelperSTRNE(const char* s1_expression,
                               const char* s2_expression,
                               const wchar_t* s1,
                               const wchar_t* s2) {
  if (!String::WideCStringEquals(s1, s2)) {
    return AssertionSuccess();
  }

  return AssertionFailure() << "Expected: (" << s1_expression << ") != ("
                            << s2_expression << "), actual: "
                            << PrintToString(s1)
                            << " vs " << PrintToString(s2);
}